

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.cpp
# Opt level: O0

String * __thiscall
Diligent::GetHLSLProfileString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,SHADER_TYPE ShaderType,
          ShaderVersion ShaderModel)

{
  Char *pCVar1;
  uint in_register_00000014;
  int iVar2;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string msg_1;
  string msg;
  SHADER_TYPE ShaderType_local;
  ShaderVersion ShaderModel_local;
  String *strShaderProfile;
  
  iVar2 = (int)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar2 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vs");
  }
  else if (iVar2 == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ps");
  }
  else if (iVar2 == 4) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gs");
  }
  else if (iVar2 == 8) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"hs");
  }
  else if (iVar2 == 0x10) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ds");
  }
  else if (iVar2 == 0x20) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"cs");
  }
  else if (iVar2 == 0x40) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"as");
  }
  else if (iVar2 == 0x80) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ms");
  }
  else if ((((iVar2 == 0x100) || (iVar2 == 0x200)) || (iVar2 == 0x400)) ||
          (((iVar2 == 0x800 || (iVar2 == 0x1000)) || (iVar2 == 0x2000)))) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"lib");
  }
  else if (iVar2 == 0x4000) {
    FormatString<char[24]>
              ((string *)((long)&msg_1.field_2 + 8),(char (*) [24])"Unsupported shader type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetHLSLProfileString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLUtils.cpp"
               ,0x58);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  else {
    FormatString<char[20]>((string *)local_70,(char (*) [20])"Unknown shader type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetHLSLProfileString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLUtils.cpp"
               ,0x5b);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
  std::__cxx11::to_string(&local_90,ShaderType);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
  std::__cxx11::to_string(&local_b0,in_register_00000014);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

String GetHLSLProfileString(SHADER_TYPE ShaderType, ShaderVersion ShaderModel)
{
    String strShaderProfile;

    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           strShaderProfile = "vs"; break;
        case SHADER_TYPE_PIXEL:            strShaderProfile = "ps"; break;
        case SHADER_TYPE_GEOMETRY:         strShaderProfile = "gs"; break;
        case SHADER_TYPE_HULL:             strShaderProfile = "hs"; break;
        case SHADER_TYPE_DOMAIN:           strShaderProfile = "ds"; break;
        case SHADER_TYPE_COMPUTE:          strShaderProfile = "cs"; break;
        case SHADER_TYPE_AMPLIFICATION:    strShaderProfile = "as"; break;
        case SHADER_TYPE_MESH:             strShaderProfile = "ms"; break;
        case SHADER_TYPE_RAY_GEN:
        case SHADER_TYPE_RAY_MISS:
        case SHADER_TYPE_RAY_CLOSEST_HIT:
        case SHADER_TYPE_RAY_ANY_HIT:
        case SHADER_TYPE_RAY_INTERSECTION:
        case SHADER_TYPE_CALLABLE:         strShaderProfile = "lib"; break;
        case SHADER_TYPE_TILE:
            UNSUPPORTED("Unsupported shader type");
            break;
        // clang-format on
        default: UNEXPECTED("Unknown shader type");
    }

    strShaderProfile += "_";
    strShaderProfile += std::to_string(ShaderModel.Major);
    strShaderProfile += "_";
    strShaderProfile += std::to_string(ShaderModel.Minor);

    return strShaderProfile;
}